

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::Config_testDefaultSamplingProbability_Test::TestBody
          (Config_testDefaultSamplingProbability_Test *this)

{
  bool bVar1;
  Config *this_00;
  char *pcVar2;
  AssertHelper local_468 [8];
  Message local_460 [8];
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> local_458;
  allocator local_439;
  string local_438;
  duration local_418;
  allocator local_409;
  string local_408;
  RestrictionsConfig local_3e8;
  HeadersConfig local_3b8;
  allocator local_331;
  string local_330;
  allocator local_309;
  string local_308;
  duration local_2e8;
  Config local_2e0;
  duration local_288;
  allocator local_279;
  string local_278;
  allocator local_241;
  string local_240;
  Config local_220;
  Config local_1c8;
  double local_28;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  Config_testDefaultSamplingProbability_Test *this_local;
  
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_240,"remote",&local_241);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_278,"http://127.0.0.1:5778/sampling",&local_279);
  local_288 = samplers::Config::defaultSamplingRefreshInterval();
  samplers::Config::Config(&local_220,&local_240,0.001,&local_278,2000,&local_288);
  local_2e8 = reporters::Config::defaultBufferFlushInterval();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_308,"127.0.0.1:6831",&local_309);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_330,"",&local_331);
  reporters::Config::Config(&local_2e0,100,&local_2e8,false,&local_308,&local_330);
  propagation::HeadersConfig::HeadersConfig(&local_3b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_408,"",&local_409);
  local_418.__r = 0;
  baggage::RestrictionsConfig::RestrictionsConfig(&local_3e8,false,&local_408,&local_418);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_438,"",&local_439);
  local_458.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_458.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_458.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::vector(&local_458);
  Config::Config(&local_1c8,false,false,&local_220,&local_2e0,&local_3b8,&local_3e8,&local_438,
                 &local_458,JAEGER);
  this_00 = Config::sampler(&local_1c8);
  local_28 = samplers::Config::param(this_00);
  testing::internal::EqHelper<false>::Compare<double,double>
            ((EqHelper<false> *)local_20,"samplers::Config::kDefaultSamplingProbability",
             "Config().sampler().param()",(double *)&samplers::Config::kDefaultSamplingProbability,
             &local_28);
  Config::~Config(&local_1c8);
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&local_458);
  std::__cxx11::string::~string((string *)&local_438);
  std::allocator<char>::~allocator((allocator<char> *)&local_439);
  baggage::RestrictionsConfig::~RestrictionsConfig(&local_3e8);
  std::__cxx11::string::~string((string *)&local_408);
  std::allocator<char>::~allocator((allocator<char> *)&local_409);
  propagation::HeadersConfig::~HeadersConfig(&local_3b8);
  reporters::Config::~Config(&local_2e0);
  std::__cxx11::string::~string((string *)&local_330);
  std::allocator<char>::~allocator((allocator<char> *)&local_331);
  std::__cxx11::string::~string((string *)&local_308);
  std::allocator<char>::~allocator((allocator<char> *)&local_309);
  samplers::Config::~Config(&local_220);
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_460);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              (local_468,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/ConfigTest.cpp"
               ,0x4e,pcVar2);
    testing::internal::AssertHelper::operator=(local_468,local_460);
    testing::internal::AssertHelper::~AssertHelper(local_468);
    testing::Message::~Message(local_460);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  return;
}

Assistant:

TEST(Config, testDefaultSamplingProbability)
{
    ASSERT_EQ(samplers::Config::kDefaultSamplingProbability,
              Config().sampler().param());
}